

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

uint prvTidygetNextErrorCode(TidyIterator *iter)

{
  uint uVar1;
  TidyIterator p_Var2;
  TidyIterator p_Var3;
  long lVar4;
  
  if (iter != (TidyIterator *)0x0) {
    p_Var3 = *iter;
    if (p_Var3 == (TidyIterator)0x0) {
      lVar4 = 0;
      p_Var3 = (TidyIterator)0x0;
    }
    else {
      uVar1 = tidyErrorCodeListSize();
      if ((TidyIterator)(ulong)uVar1 < p_Var3) {
        lVar4 = 0;
      }
      else {
        lVar4 = (long)p_Var3 * 0x10 + 0x1d2f30;
        p_Var3 = (TidyIterator)((long)&p_Var3->_opaque + 1);
      }
    }
    uVar1 = tidyErrorCodeListSize();
    p_Var2 = (TidyIterator)0x0;
    if (p_Var3 <= (TidyIterator)(ulong)uVar1) {
      p_Var2 = p_Var3;
    }
    *iter = p_Var2;
    return *(uint *)(lVar4 + 8);
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/message.c"
                ,0x5d4,"uint prvTidygetNextErrorCode(TidyIterator *)");
}

Assistant:

uint TY_(getNextErrorCode)( TidyIterator* iter )
{
    const tidyStringsKeyItem *item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyErrorCodeListSize() )
    {
        item = &tidyStringsKeys[itemIndex - 1];
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyErrorCodeListSize() ? itemIndex : (size_t)0 );
    return item->value;
}